

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O3

pair<vec3f,_vec3f> * __thiscall
BsplineCurve::atParam(pair<vec3f,_vec3f> *__return_storage_ptr__,BsplineCurve *this,double t)

{
  undefined4 uVar1;
  double dVar2;
  undefined4 uVar3;
  pointer pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  undefined8 *puVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  double dVar24;
  undefined8 uVar25;
  double dVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double adStack_40 [2];
  ulong uVar17;
  
  pvVar4 = (this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = ((long)(this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 2) *
           -0x5555555555555555;
  iVar9 = (int)uVar15;
  uVar16 = iVar9 + 3;
  uVar17 = (ulong)uVar16;
  dVar8 = (double)(int)uVar16;
  dVar26 = (double)iVar9 / dVar8 - 3.0 / dVar8;
  dVar24 = t * dVar26 + 3.0 / dVar8;
  lVar10 = uVar17 * -0x20;
  if (0 < (int)uVar16) {
    lVar22 = uVar17 - 1;
    auVar30._8_4_ = (int)lVar22;
    auVar30._0_8_ = lVar22;
    auVar30._12_4_ = (int)((ulong)lVar22 >> 0x20);
    puVar19 = (ulong *)(&stack0xffffffffffffffe8 + lVar10);
    uVar20 = 0;
    auVar30 = auVar30 ^ _DAT_00153050;
    auVar37._8_4_ = 0xffffffff;
    auVar37._0_8_ = 0xffffffffffffffff;
    auVar37._12_4_ = 0xffffffff;
    auVar40 = _DAT_001565b0;
    do {
      auVar41 = auVar40 ^ _DAT_00153050;
      lVar22 = auVar40._8_8_;
      if ((bool)(~(auVar41._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar41._0_4_ ||
                  auVar30._4_4_ < auVar41._4_4_) & 1)) {
        puVar19[-4] = ~-(ulong)(dVar24 < (double)(int)uVar20 / dVar8) &
                      -(ulong)(dVar24 < (double)(int)(auVar40._0_8_ + 1) / dVar8) &
                      0x3ff0000000000000;
      }
      if ((auVar41._12_4_ != auVar30._12_4_ || auVar41._8_4_ <= auVar30._8_4_) &&
          auVar41._12_4_ <= auVar30._12_4_) {
        *puVar19 = ~-(ulong)(dVar24 < (double)((int)uVar20 + 1) / dVar8) &
                   -(ulong)(dVar24 < (double)(int)(lVar22 - auVar37._8_8_) / dVar8) &
                   0x3ff0000000000000;
      }
      uVar20 = uVar20 + 2;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar22 + 2;
      puVar19 = puVar19 + 8;
    } while ((iVar9 + 4U & 0xfffffffe) != uVar20);
  }
  uVar18 = iVar9 + 2;
  uVar27 = SUB84(dVar8,0);
  uVar28 = (undefined4)((ulong)dVar8 >> 0x20);
  pdVar21 = (double *)(&stack0xffffffffffffffe8 + lVar10);
  lVar22 = 1;
  iVar14 = 2;
  do {
    dVar29 = (double)DAT_00156ab0;
    dVar31 = DAT_00156ab0._8_8_;
    if (lVar22 < (int)uVar16) {
      dVar2 = adStack_40[uVar17 * -4 + lVar22];
      uVar20 = 0;
      pdVar23 = pdVar21;
      do {
        iVar11 = (int)uVar20;
        auVar38._4_4_ = 0;
        auVar38._0_4_ = (int)lVar22 + iVar11;
        auVar38._8_4_ = iVar11;
        auVar38._12_4_ = 0;
        auVar39._0_8_ = SUB168(auVar38 | _DAT_00156ab0,0) - dVar29;
        auVar39._8_8_ = SUB168(auVar38 | _DAT_00156ab0,8) - dVar31;
        auVar41._8_4_ = uVar27;
        auVar41._0_8_ = dVar8;
        auVar41._12_4_ = uVar28;
        auVar40 = divpd(auVar39,auVar41);
        uVar20 = uVar20 + 1;
        auVar42._4_4_ = 0;
        auVar42._0_4_ = iVar11 + iVar14;
        auVar42._8_4_ = (int)uVar20;
        auVar42._12_4_ = 0;
        auVar43._0_8_ = SUB168(auVar42 | _DAT_00156ab0,0) - dVar29;
        auVar43._8_8_ = SUB168(auVar42 | _DAT_00156ab0,8) - dVar31;
        auVar5._8_4_ = uVar27;
        auVar5._0_8_ = dVar8;
        auVar5._12_4_ = uVar28;
        auVar30 = divpd(auVar43,auVar5);
        dVar36 = ((dVar24 - auVar40._8_8_) / (auVar40._0_8_ - auVar40._8_8_)) * dVar2;
        dVar2 = *pdVar23;
        pdVar23[-3] = ((auVar30._0_8_ - dVar24) / (auVar30._0_8_ - auVar30._8_8_)) * dVar2 + dVar36;
        pdVar23 = pdVar23 + 4;
      } while (uVar18 != uVar20);
    }
    lVar22 = lVar22 + 1;
    uVar18 = uVar18 - 1;
    iVar14 = iVar14 + 1;
    pdVar21 = pdVar21 + 1;
  } while (lVar22 != 4);
  if (iVar9 + -1 < 0) {
    uVar25 = 0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
  }
  else {
    puVar13 = (undefined8 *)(&stack0xfffffffffffffff8 + lVar10);
    pfVar12 = &pvVar4->z;
    uVar25 = 0;
    fVar32 = 0.0;
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    uVar17 = 0;
    do {
      uVar1 = ((vec3f *)(pfVar12 + -2))->x;
      uVar3 = ((vec3f *)(pfVar12 + -2))->y;
      auVar49._0_4_ = (int)uVar17 + 3;
      uVar20 = uVar17 + 1;
      auVar49._4_4_ = 0;
      auVar49._8_4_ = (int)uVar17 + 4;
      auVar49._12_4_ = 0;
      auVar50._0_8_ = SUB168(auVar49 | _DAT_00156ab0,0) - dVar29;
      auVar50._8_8_ = SUB168(auVar49 | _DAT_00156ab0,8) - dVar31;
      auVar6._8_4_ = uVar27;
      auVar6._0_8_ = dVar8;
      auVar6._12_4_ = uVar28;
      auVar30 = divpd(auVar50,auVar6);
      auVar45._0_8_ = uVar17 & 0xffffffff;
      auVar45._8_4_ = (int)uVar20;
      auVar45._12_4_ = 0;
      auVar46._0_8_ = SUB168(auVar45 | _DAT_00156ab0,0) - dVar29;
      auVar46._8_8_ = SUB168(auVar45 | _DAT_00156ab0,8) - dVar31;
      auVar7._8_4_ = uVar27;
      auVar7._0_8_ = dVar8;
      auVar7._12_4_ = uVar28;
      auVar40 = divpd(auVar46,auVar7);
      auVar51._0_8_ = auVar30._0_8_ - auVar40._0_8_;
      auVar51._8_8_ = auVar30._8_8_ - auVar40._8_8_;
      auVar47._8_8_ = *puVar13;
      auVar47._0_8_ = puVar13[-4];
      auVar40 = divpd(auVar47,auVar51);
      fVar44 = (float)(auVar40._0_8_ - auVar40._8_8_);
      fVar48 = (float)(double)puVar13[-3];
      uVar25 = CONCAT44((float)((ulong)uVar25 >> 0x20) + fVar48 * (float)uVar3,
                        (float)uVar25 + fVar48 * (float)uVar1);
      fVar32 = fVar32 + (float)uVar1 * 3.0 * fVar44;
      fVar33 = fVar33 + (float)*(undefined8 *)(pfVar12 + -1) * 3.0 * fVar44;
      fVar34 = fVar34 + (float)((ulong)*(undefined8 *)(pfVar12 + -1) >> 0x20) * 3.0 * fVar44;
      fVar35 = fVar35 + *pfVar12 * fVar48;
      puVar13 = puVar13 + 4;
      pfVar12 = pfVar12 + 3;
      uVar17 = uVar20;
    } while ((uVar15 & 0xffffffff) != uVar20);
  }
  fVar44 = (float)dVar26;
  (__return_storage_ptr__->first).x = (float)(int)uVar25;
  (__return_storage_ptr__->first).y = (float)(int)((ulong)uVar25 >> 0x20);
  (__return_storage_ptr__->first).z = fVar35;
  (__return_storage_ptr__->second).x = fVar44 * fVar32;
  (__return_storage_ptr__->second).y = fVar44 * fVar33;
  (__return_storage_ptr__->second).z = fVar34 * fVar44;
  return __return_storage_ptr__;
}

Assistant:

std::pair<vec3f, vec3f> atParam(double t) const
    {
        const int n = controls.size()-1;
        const int k = 3;
        double tmin = (double)k/(n+k+1);
        double tmax = (double)(n+1)/(n+k+1);
        // de-normalize parameter
        t = tmin + t * (tmax - tmin);

        #define t_(i) ((double)(i)/(n+k+1))
        double B[n+k+1][k+1];
        for (int i=0; i<n+k+1; ++i)
            B[i][0] = (t_(i)<=t && t<t_(i+1))? 1: 0;
        for (int p=1; p<=k; ++p)
            for (int i=0; i+p<n+k+1; ++i)
                B[i][p] = (t-t_(i))/(t_(i+p)-t_(i))*B[i][p-1] + (t_(i+p+1)-t)/(t_(i+p+1)-t_(i+1))*B[i+1][p-1];
        vec3f res(0), der(0);
        double t0=0;
        for (int i=0; i<=n; ++i) {
            res += controls[i] * B[i][k];
            t0 += B[i][k];
            der += controls[i] * k * (B[i][k-1]/(t_(i+k)-t_(i)) - B[i+1][k-1]/(t_(i+k+1)-t_(i+1)));
        }
        #undef t_
        return {res, der * (tmax-tmin)};
    }